

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FragCoordXYZCase::iterate(FragCoordXYZCase *this)

{
  int height;
  TestLog *log;
  RenderContext *pRVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar6;
  TestError *this_00;
  char *description;
  int y;
  uint uVar7;
  int x;
  undefined1 auVar8 [16];
  allocator<char> local_2a5;
  float local_2a4;
  RGBA local_2a0;
  RGBA threshold;
  Surface refImg;
  Vec3 scaledFC;
  Vector<float,_3> local_258;
  FragCoordXYZCase *local_248;
  TestLog *local_240;
  deUint16 indices [6];
  float positions [16];
  Surface testImg;
  VertexArrayBinding posBinding;
  ShaderProgram program;
  long lVar5;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar6->m_width;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = pRVar6->m_height;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010101;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  posBinding.binding.type = (Type)tcu::PixelFormat::getColorThreshold(&pRVar6->m_pixelFormat);
  threshold = tcu::operator+((RGBA *)&program,(RGBA *)&posBinding);
  auVar8._0_4_ = (float)iVar3;
  auVar8._4_4_ = (float)height;
  auVar8._8_8_ = 0;
  auVar8 = divps(_DAT_01675880,auVar8);
  local_258.m_data._0_8_ = auVar8._0_8_;
  local_258.m_data[2] = 1.0;
  tcu::Surface::Surface(&testImg,iVar3,height);
  tcu::Surface::Surface(&refImg,iVar3,height);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)positions,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)indices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&scaledFC,
             "#version 300 es\nuniform highp vec3 u_scale;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(gl_FragCoord.xyz*u_scale, 1.0);\n}\n"
             ,&local_2a5);
  glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)positions,(string *)&scaledFC);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)&scaledFC);
  std::__cxx11::string::~string((string *)positions);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk != false) {
    positions[0xc] = 1.0;
    positions[0xd] = -1.0;
    positions[0xe] = 1.0;
    positions[0xf] = 1.0;
    positions[8] = 1.0;
    positions[9] = 1.0;
    positions[10] = 0.0;
    positions[0xb] = 1.0;
    positions[4] = -1.0;
    positions[5] = -1.0;
    positions[6] = 0.0;
    positions[7] = 1.0;
    positions[0] = -1.0;
    positions[1] = 1.0;
    positions[2] = -1.0;
    positions[3] = 1.0;
    indices[0] = 0;
    indices[1] = 1;
    indices[2] = 2;
    indices[3] = 2;
    indices[4] = 1;
    indices[5] = 3;
    uVar4 = (**(code **)(lVar5 + 0xb48))(program.m_program.m_program,"u_scale");
    std::__cxx11::string::string<std::allocator<char>>((string *)&scaledFC,"a_position",&local_2a5);
    glu::va::Float(&posBinding,(string *)&scaledFC,4,4,0,positions);
    std::__cxx11::string::~string((string *)&scaledFC);
    (**(code **)(lVar5 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar5 + 0x1568))(uVar4,1,&local_258);
    scaledFC.m_data[0] = 0.0;
    scaledFC.m_data[1] = 8.40779e-45;
    scaledFC.m_data[2] = 1.4013e-45;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,1,
              &posBinding,(PrimitiveList *)&scaledFC,(DrawUtilCallback *)0x0);
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&scaledFC,&testImg);
    glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)&scaledFC);
    err = (**(code **)(lVar5 + 0x800))();
    glu::checkError(err,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x15b);
    local_248 = this;
    local_240 = log;
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    for (uVar7 = 0; (int)uVar7 < refImg.m_height; uVar7 = uVar7 + 1) {
      local_2a4 = (float)(int)uVar7 + 0.5;
      for (iVar3 = 0; iVar3 < refImg.m_width; iVar3 = iVar3 + 1) {
        positions[1] = local_2a4;
        positions[0] = (float)iVar3 + 0.5;
        positions[2] = (((float)(int)(refImg.m_height + ~uVar7) + 0.5) / (float)refImg.m_height +
                       ((float)iVar3 + 0.5) / (float)refImg.m_width) * 0.5;
        tcu::operator*((tcu *)&scaledFC,(Vector<float,_3> *)positions,&local_258);
        posBinding.binding.type = (Type)scaledFC.m_data[0];
        posBinding.binding._4_4_ = scaledFC.m_data[1];
        posBinding.binding.name._M_dataplus._M_p._0_4_ = scaledFC.m_data[2];
        posBinding.binding.name._M_dataplus._M_p._4_4_ = 0x3f800000;
        tcu::RGBA::RGBA(&local_2a0,(Vec4 *)&posBinding);
        *(deUint32 *)((long)refImg.m_pixels.m_ptr + (long)(int)(refImg.m_width * uVar7 + iVar3) * 4)
             = local_2a0.m_value;
      }
    }
    bVar2 = tcu::pixelThresholdCompare
                      (local_240,"Result","Image comparison result",&refImg,&testImg,&threshold,
                       COMPARE_LOG_RESULT);
    description = "Image comparison failed";
    if (bVar2) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,
               description);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::Surface::~Surface(&refImg);
    tcu::Surface::~Surface(&testImg);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&posBinding,"Compile failed",(allocator<char> *)positions);
  tcu::TestError::TestError(this_00,(string *)&posBinding);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();
		const tcu::Vec3			scale		(1.f / float(width), 1.f / float(height), 1.0f);

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"uniform highp vec3 u_scale;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = vec4(gl_FragCoord.xyz*u_scale, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-1.0f,  1.0f, -1.0f, 1.0f,
				-1.0f, -1.0f,  0.0f, 1.0f,
				 1.0f,  1.0f,  0.0f, 1.0f,
				 1.0f, -1.0f,  1.0f, 1.0f
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			const int				scaleLoc	= gl.getUniformLocation(program.getProgram(), "u_scale");
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());
			gl.uniform3fv(scaleLoc, 1, scale.getPtr());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			z			= (xf + yf) / 2.0f;
				const tcu::Vec3		fragCoord	(float(x)+.5f, float(y)+.5f, z);
				const tcu::Vec3		scaledFC	= fragCoord*scale;
				const tcu::Vec4		color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}